

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O2

Am_Value value_from_command_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Slot_Key in_SI;
  Am_Value AVar3;
  Am_Object part;
  Am_Value local_20;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  if (value_from_command_proc(Am_Object&)::val == '\0') {
    iVar2 = __cxa_guard_acquire(&value_from_command_proc(Am_Object&)::val);
    if (iVar2 != 0) {
      Am_String::Am_String(&value_from_command_proc::val,"",true);
      __cxa_atexit(Am_String::~Am_String,&value_from_command_proc::val,&__dso_handle);
      __cxa_guard_release(&value_from_command_proc(Am_Object&)::val);
    }
  }
  Am_Object::Get_Object(&part,in_SI,0xc5);
  bVar1 = Am_Object::Valid(&part);
  if (bVar1) {
    in_value = Am_Object::Get(&part,0x169,0);
    Am_Value::operator=((Am_Value *)self,in_value);
  }
  else {
    Am_Value::Am_Value(&local_20,&value_from_command_proc::val);
    Am_Value::operator=((Am_Value *)self,&local_20);
    Am_Value::~Am_Value(&local_20);
  }
  Am_Object::~Am_Object(&part);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

Am_Define_Formula(Am_Value, value_from_command)
{
  Am_Value value;
  static Am_String val("");

  Am_Object part = self.Get_Object(Am_COMMAND);
  if (part.Valid())
    value = part.Get(Am_VALUE);
  else
    value = Am_Value(val);
  return value;
}